

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  XMLCh *src;
  XMLCh *src_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  MemoryManager *pMVar4;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this;
  DatatypeValidator *valueToAdopt;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  undefined4 extraout_var;
  XMLStringPool *pXVar7;
  undefined4 extraout_var_00;
  ulong uVar8;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  ArrayJanitor<char16_t> janName;
  char16_t *toDelete;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar4);
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,hashModulus,toAdopt,pMVar4);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    for (uVar8 = 0; uVar8 < itemNumber; uVar8 = uVar8 + 1) {
      valueToAdopt = DatatypeValidator::loadDV(serEng);
      src = valueToAdopt->fTypeLocalName;
      src_00 = valueToAdopt->fTypeUri;
      XVar5 = XMLString::stringLen(src_00);
      XVar6 = XMLString::stringLen(src);
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      iVar2 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4,(XVar6 + XVar5) * 2 + 4);
      toDelete = (char16_t *)CONCAT44(extraout_var,iVar2);
      memmove(toDelete,src_00,XVar5 * 2 + 2);
      (toDelete + XVar5 + 1)[-1] = L',';
      memmove(toDelete + XVar5 + 1,src,XVar6 * 2 + 2);
      toDelete[XVar6 + XVar5 + 1] = L'\0';
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      ArrayJanitor<char16_t>::ArrayJanitor(&janName,toDelete,pMVar4);
      pXVar7 = XSerializeEngine::getStringPool(serEng);
      uVar3 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[9])(pXVar7,toDelete);
      pXVar7 = XSerializeEngine::getStringPool(serEng);
      iVar2 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[10])(pXVar7,(ulong)uVar3);
      RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
                (*objToLoad,(void *)CONCAT44(extraout_var_00,iVar2),valueToAdopt);
      ArrayJanitor<char16_t>::~ArrayJanitor(&janName);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DatatypeValidator>** objToLoad
                                   , int
                                   , bool                                toAdopt
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DatatypeValidator>(
                                                               hashModulus
                                                             , toAdopt
                                                             , serEng.getMemoryManager()
                                                             );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DatatypeValidator*  data;
            data = DatatypeValidator::loadDV(serEng);

            /***
             *   restore the key
             ***/
            XMLCh*       typeUri   = (XMLCh*) data->getTypeUri();
            XMLCh*       typeLocal = (XMLCh*) data->getTypeLocalName();
            XMLSize_t    uriLen    = XMLString::stringLen(typeUri);
            XMLSize_t    localLen  = XMLString::stringLen(typeLocal);
            XMLCh*       typeKey   = (XMLCh*) serEng.getMemoryManager()->allocate
                                     (
                                       (uriLen + localLen + 2) * sizeof(XMLCh)
                                     );
            // "typeuri,typeLocal"
            XMLString::moveChars(typeKey, typeUri, uriLen+1);
            typeKey[uriLen] = chComma;
            XMLString::moveChars(&typeKey[uriLen+1], typeLocal, localLen+1);
            typeKey[uriLen + localLen + 1] = chNull;
            ArrayJanitor<XMLCh> janName(typeKey, serEng.getMemoryManager());

            /*
             * get the string from string pool
             *
             *  to do:
             ***/
            unsigned int id = serEng.getStringPool()->getId(typeKey);
            XMLCh* refKey = (XMLCh*) serEng.getStringPool()->getValueForId(id);

            (*objToLoad)->put((void*)refKey, data);
        }
    }
}